

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  size_t sVar2;
  size_t slotCount;
  long lVar3;
  sysbvm_bitflags_t sVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sVar6;
  sysbvm_tuple_t astNode_;
  sysbvm_bitflags_t sVar7;
  size_t local_c0;
  size_t i;
  _Bool isMemoizedTemplate;
  sysbvm_bitflags_t flags;
  size_t applicationArgumentCount;
  size_t sendArgumentStartIndex;
  size_t sendArgumentCount;
  size_t typeArgumentCount;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_40_5_ec72e70e gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_astMessageSendNode_t **sendNode;
  sysbvm_simpleFunctionType_t **simpleFunctionType;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  psVar1 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x28);
  memset(&typeArgumentCount,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&typeArgumentCount);
  sVar2 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x100));
  slotCount = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*psVar1 + 0x40));
  lVar3 = (long)(int)(uint)(*(long *)(*psVar1 + 0x28) != 0);
  if (lVar3 + slotCount != sVar2) {
    sysbvm_error("Expected number of arguments is mismatching.");
  }
  sVar4 = sysbvm_tuple_bitflags_decode(*(sysbvm_tuple_t *)(*arguments + 0xf8));
  if (lVar3 != 0) {
    sVar5 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x100),0);
    gcFrameRecord.roots =
         (sysbvm_tuple_t *)
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                   (context,*(sysbvm_tuple_t *)(*psVar1 + 0x28),sVar5,arguments[2]);
    *(sysbvm_tuple_t **)(*psVar1 + 0x28) = gcFrameRecord.roots;
  }
  sVar5 = sysbvm_array_create(context,slotCount);
  for (local_c0 = 0; local_c0 < slotCount; local_c0 = local_c0 + 1) {
    sVar6 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x100),lVar3 + local_c0);
    astNode_ = sysbvm_array_at(*(sysbvm_tuple_t *)(*psVar1 + 0x40),local_c0);
    sVar6 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                      (context,astNode_,sVar6,arguments[2]);
    sysbvm_array_atPut(sVar5,local_c0,sVar6);
  }
  *(sysbvm_tuple_t *)(*psVar1 + 0x40) = sVar5;
  *(undefined8 *)(*psVar1 + 0x20) = *(undefined8 *)(*arguments + 0x108);
  sVar7 = sysbvm_tuple_bitflags_decode(*(sysbvm_tuple_t *)(*psVar1 + 0x60));
  sVar5 = sysbvm_tuple_bitflags_encode(sVar7 | (long)(int)(uint)((sVar4 & 0x600) != 0x600) | 2);
  *(sysbvm_tuple_t *)(*psVar1 + 0x60) = sVar5;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&typeArgumentCount);
  return *psVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_simpleFunctionType_t **simpleFunctionType = (sysbvm_simpleFunctionType_t**)&arguments[0];
    sysbvm_astMessageSendNode_t **sendNode = (sysbvm_astMessageSendNode_t**)&arguments[1];
    sysbvm_tuple_t *environment = &arguments[2];

    struct {
        sysbvm_tuple_t analyzedReceiver;

        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;
        sysbvm_tuple_t expectedArgumentType;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t typeArgumentCount = sysbvm_array_getSize((*simpleFunctionType)->argumentTypes);
    size_t sendArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
    size_t sendArgumentStartIndex = (*sendNode)->receiver ? 1 : 0;

    size_t applicationArgumentCount = sendArgumentStartIndex + sendArgumentCount;
    if(applicationArgumentCount != typeArgumentCount)
        sysbvm_error("Expected number of arguments is mismatching.");

    sysbvm_bitflags_t flags = sysbvm_tuple_bitflags_decode((*simpleFunctionType)->super.functionFlags);
    bool isMemoizedTemplate = (flags & SYSBVM_FUNCTION_FLAGS_MEMOIZED_TEMPLATE) == SYSBVM_FUNCTION_FLAGS_MEMOIZED_TEMPLATE;

    // Analyze the receiver
    if(sendArgumentStartIndex > 0)
    {
        gcFrame.expectedArgumentType = sysbvm_array_at((*simpleFunctionType)->argumentTypes, 0);
        gcFrame.analyzedReceiver = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, (*sendNode)->receiver, gcFrame.expectedArgumentType, *environment);
        (*sendNode)->receiver = gcFrame.analyzedReceiver;
    }

    // Analyze the send arguments.
    gcFrame.analyzedArguments = sysbvm_array_create(context, sendArgumentCount);
    for(size_t i = 0; i < sendArgumentCount; ++i)
    {
        gcFrame.expectedArgumentType = sysbvm_array_at((*simpleFunctionType)->argumentTypes, sendArgumentStartIndex + i);
        gcFrame.argumentNode = sysbvm_array_at((*sendNode)->arguments, i);
        gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.argumentNode, gcFrame.expectedArgumentType, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgument);
    }

    (*sendNode)->arguments = gcFrame.analyzedArguments;
    (*sendNode)->super.analyzedType = (*simpleFunctionType)->resultType;
    (*sendNode)->applicationFlags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode((*sendNode)->applicationFlags)
        | (isMemoizedTemplate ? 0 : SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK)
        | SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)*sendNode;
}